

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O0

mpt_named_traits * mpt_named_traits(char *name,int len)

{
  mpt_named_traits *pmVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  mpt_named_traits *elem_3;
  mpt_named_traits *elem_2;
  mpt_named_traits *elem_1;
  mpt_named_traits *elem;
  named_traits_chunk *pnStack_28;
  int i;
  named_traits_chunk *ext;
  char *pcStack_18;
  int len_local;
  char *name_local;
  
  if (((name == (char *)0x0) || (len == 0)) || (*name == '\0')) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else if (len < 0) {
    sVar4 = strlen(name);
    if ((int)sVar4 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
    }
    else {
      iVar2 = strcmp(name,"log");
      if (iVar2 == 0) {
        pcStack_18 = "logger";
      }
      else {
        iVar2 = strcmp(name,"iter");
        if (iVar2 == 0) {
          pcStack_18 = "iterator";
        }
        else {
          iVar2 = strcmp(name,"out");
          if (iVar2 == 0) {
            pcStack_18 = "output";
          }
          else {
            iVar2 = strcmp(name,"meta");
            pcStack_18 = name;
            if (iVar2 == 0) {
              pcStack_18 = "metatype";
            }
          }
        }
      }
      pnStack_28 = meta_types;
      if (meta_types == (named_traits_chunk *)0x0) {
        _meta_init();
        pnStack_28 = meta_types;
      }
      for (; pnStack_28 != (named_traits_chunk *)0x0; pnStack_28 = pnStack_28->next) {
        for (elem._4_4_ = 0; elem._4_4_ < (int)(uint)pnStack_28->used; elem._4_4_ = elem._4_4_ + 1)
        {
          pmVar1 = pnStack_28->traits[elem._4_4_];
          if ((pmVar1->name != (char *)0x0) && (iVar2 = strcmp(pcStack_18,pmVar1->name), iVar2 == 0)
             ) {
            return pmVar1;
          }
        }
      }
      if (interface_types == (mpt_named_traits **)0x0) {
        _interfaces_init();
      }
      for (elem._4_4_ = 0; elem._4_4_ < interface_pos; elem._4_4_ = elem._4_4_ + 1) {
        pmVar1 = interface_types[elem._4_4_];
        if (((pmVar1 != (mpt_named_traits *)0x0) && (pmVar1->name != (char *)0x0)) &&
           (iVar2 = strcmp(pcStack_18,pmVar1->name), iVar2 == 0)) {
          return pmVar1;
        }
      }
      piVar3 = __errno_location();
      *piVar3 = 0x16;
    }
  }
  else {
    pnStack_28 = meta_types;
    if (meta_types == (named_traits_chunk *)0x0) {
      _meta_init();
      pnStack_28 = meta_types;
    }
    for (; pnStack_28 != (named_traits_chunk *)0x0; pnStack_28 = pnStack_28->next) {
      for (elem._4_4_ = 0; elem._4_4_ < (int)(uint)pnStack_28->used; elem._4_4_ = elem._4_4_ + 1) {
        pmVar1 = pnStack_28->traits[elem._4_4_];
        if (((pmVar1->name != (char *)0x0) && (sVar4 = strlen(pmVar1->name), len == (int)sVar4)) &&
           (iVar2 = strncmp(name,pmVar1->name,(long)len), iVar2 == 0)) {
          return pmVar1;
        }
      }
    }
    if (interface_types == (mpt_named_traits **)0x0) {
      _interfaces_init();
    }
    for (elem._4_4_ = 0; elem._4_4_ < interface_pos; elem._4_4_ = elem._4_4_ + 1) {
      pmVar1 = interface_types[elem._4_4_];
      if (((pmVar1 != (mpt_named_traits *)0x0) && (pmVar1->name != (char *)0x0)) &&
         ((sVar4 = strlen(pmVar1->name), len == (int)sVar4 &&
          (iVar2 = strncmp(name,pmVar1->name,(long)len), iVar2 == 0)))) {
        return pmVar1;
      }
    }
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  return (mpt_named_traits *)0x0;
}

Assistant:

extern const MPT_STRUCT(named_traits) *mpt_named_traits(const char *name, int len)
{
	const struct named_traits_chunk *ext;
	
	int i;
	
	if (!name || !len || !*name) {
		errno = EINVAL;
		return 0;
	}
	/* exact length match for names */
	if (len >= 0) {
		if (!(ext = meta_types)) {
			_meta_init();
			ext = meta_types;
		}
		while (ext) {
			for (i = 0; i < ext->used; i++) {
				const MPT_STRUCT(named_traits) *elem = ext->traits[i];
				if (elem->name
				 && (len == (int) strlen(elem->name))
				 && !strncmp(name, elem->name, len)) {
					return elem;
				}
			}
			ext = ext->next;
		}
		if (!interface_types) {
			_interfaces_init();
		}
		for (i = 0; i < interface_pos; i++) {
			const MPT_STRUCT(named_traits) *elem;
			if ((elem = interface_types[i])
			 && elem->name
			 && (len == (int) strlen(elem->name))
			 && !strncmp(name, elem->name, len)) {
				return elem;
			}
		}
		errno = EINVAL;
		return 0;
	}
	/* full names without length limit */
	if (!(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	/* resolve shortnames */
	if (!strcmp(name, "log")) {
		name = "logger";
	}
	else if (!strcmp(name, "iter")) {
		name = "iterator";
	}
	else if (!strcmp(name, "out")) {
		name = "output";
	}
	else if (!strcmp(name, "meta")) {
		name = "metatype";
	}
	if (!(ext = meta_types)) {
		_meta_init();
		ext = meta_types;
	}
	while (ext) {
		for (i = 0; i < ext->used; i++) {
			const MPT_STRUCT(named_traits) *elem = ext->traits[i];
			if (elem->name && !strcmp(name, elem->name)) {
				return elem;
			}
		}
		ext = ext->next;
	}
	if (!interface_types) {
		_interfaces_init();
	}
	for (i = 0; i < interface_pos; i++) {
		const MPT_STRUCT(named_traits) *elem = interface_types[i];
		if (elem && elem->name && !strcmp(name, elem->name)) {
			return elem;
		}
	}
	errno = EINVAL;
	return 0;
}